

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O1

bool __thiscall dd::ProcessThreadImpl::Process(ProcessThreadImpl *this)

{
  Lock *__mutex;
  iterator *piVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  pointer pDVar4;
  pointer pDVar5;
  _Elt_pointer ppQVar6;
  QueuedTask *pQVar7;
  _List_node_base *p_Var8;
  int iVar9;
  long lVar10;
  long lVar11;
  _List_node_base *p_Var12;
  long lVar13;
  
  lVar10 = std::chrono::_V2::system_clock::now();
  lVar13 = -(lVar10 >> 0x3f);
  lVar10 = lVar10 / 1000000 + (lVar10 >> 0x3f);
  p_Var12 = (_List_node_base *)(lVar10 + lVar13 + 60000);
  __mutex = &this->_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  bVar2 = this->_stop;
  if (bVar2 == false) {
    lVar10 = lVar10 + lVar13;
    p_Var3 = (this->_modules).
             super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&this->_modules) {
      if (p_Var3[1]._M_prev == (_List_node_base *)0x0) {
        lVar13 = (**(code **)(p_Var3[1]._M_next)->_M_next)();
        if (lVar13 < 1) {
          lVar13 = 0;
        }
        p_Var3[1]._M_prev = (_List_node_base *)(lVar13 + lVar10);
      }
      if ((long)p_Var3[1]._M_prev <= lVar10 ||
          p_Var3[1]._M_prev == (_List_node_base *)0xffffffffffffffff) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
        lVar13 = std::chrono::_V2::system_clock::now();
        lVar11 = (**(code **)(p_Var3[1]._M_next)->_M_next)();
        if (lVar11 < 1) {
          lVar11 = 0;
        }
        p_Var3[1]._M_prev = (_List_node_base *)(lVar13 / 1000000 + lVar11);
      }
      p_Var8 = p_Var3 + 1;
      p_Var3 = p_Var3->_M_next;
      if ((long)p_Var8->_M_prev < (long)p_Var12) {
        p_Var12 = p_Var8->_M_prev;
      }
    }
    while( true ) {
      pDVar4 = (this->_delayed_tasks).c.
               super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar5 = (this->_delayed_tasks).c.
               super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pDVar4 == pDVar5) break;
      if (lVar10 < pDVar4->run_at_ms) {
        if ((pDVar4 != pDVar5) && ((long)pDVar4->run_at_ms < (long)p_Var12)) {
          p_Var12 = (_List_node_base *)pDVar4->run_at_ms;
        }
        break;
      }
      ppQVar6 = (this->_queue).c.
                super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (ppQVar6 ==
          (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>::
        _M_push_back_aux<dd::QueuedTask*const&>
                  ((deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>> *)&this->_queue,
                   &pDVar4->task);
      }
      else {
        *ppQVar6 = pDVar4->task;
        piVar1 = &(this->_queue).c.
                  super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      std::
      priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
      ::pop(&this->_delayed_tasks);
    }
    while (ppQVar6 = (this->_queue).c.
                     super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur,
          (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur != ppQVar6) {
      pQVar7 = *ppQVar6;
      std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::pop_front(&(this->_queue).c);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar9 = (*pQVar7->_vptr_QueuedTask[2])(pQVar7);
      if ((char)iVar9 != '\0') {
        (*pQVar7->_vptr_QueuedTask[1])(pQVar7);
      }
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar2 == false) {
    lVar10 = std::chrono::_V2::system_clock::now();
    lVar10 = SUB168(SEXT816(lVar10) * SEXT816(-0x431bde82d7b634db),8);
    lVar10 = ((lVar10 >> 0x12) - (lVar10 >> 0x3f)) + (long)p_Var12;
    if (0 < lVar10) {
      iVar9 = (int)lVar10;
      Event::Wait(&this->_wake_up,iVar9,-(uint)(iVar9 != -1) | 3000);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ProcessThreadImpl::Process() {
		int64_t now = GetCurrentTick();
		int64_t next_checkpoint = now + (1000 * 60);

		{
			AutoLock l(_lock);
			if (_stop)
				return false;
			for (ModuleCallback& m : _modules) {
				if (m.next_callback == 0)
					m.next_callback = GetNextCallbackTime(m.module, now);
				if (m.next_callback <= now || m.next_callback == kCallProcessImmediately) {
					{
						m.module->Process();
					}
					int64_t new_now = GetCurrentTick();
					m.next_callback = GetNextCallbackTime(m.module, new_now);
				}

				if (m.next_callback < next_checkpoint)
					next_checkpoint = m.next_callback;
			}

			while (!_delayed_tasks.empty() && _delayed_tasks.top().run_at_ms <= now) {
				_queue.push(_delayed_tasks.top().task);
				_delayed_tasks.pop();
			}

			if (!_delayed_tasks.empty())
			{
				if (_delayed_tasks.top().run_at_ms < next_checkpoint)
					next_checkpoint = _delayed_tasks.top().run_at_ms;
			}

			while (!_queue.empty()) {
				QueuedTask* task = _queue.front();
				_queue.pop();
				_lock.LockEnd();
				if (task->Run())
					delete task;
				_lock.LockBegin();
			}
		}
		
		int64_t time_to_wait = next_checkpoint - GetCurrentTick();
		if (time_to_wait > 0)
			_wake_up.Wait(static_cast<int>(time_to_wait));
		return true;
	}